

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

void __thiscall OpenMD::Integrator::integrate(Integrator *this)

{
  RealType RVar1;
  
  (*this->_vptr_Integrator[2])();
  while( true ) {
    RVar1 = Snapshot::getTime(this->snap);
    if (this->runTime < RVar1) break;
    (*this->_vptr_Integrator[3])(this);
    (*this->_vptr_Integrator[4])(this);
    (*this->_vptr_Integrator[6])(this);
  }
  (*this->_vptr_Integrator[7])(this);
  return;
}

Assistant:

void Integrator::integrate() {
    initialize();

    while (snap->getTime() <= runTime) {
      preStep();
      step();
      postStep();
    }

    finalize();
  }